

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O1

bool cmIncludeGuardCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *pcVar2;
  int iVar3;
  string *psVar4;
  cmValue cVar5;
  cmState *pcVar6;
  cmake *this;
  bool bVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view input;
  cmStateDirectory stateDir;
  cmStateSnapshot dirSnapshot;
  string includeGuardVar;
  cmCryptoHash hasher;
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  string *local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  string local_a8;
  string local_80;
  string local_60;
  cmCryptoHash local_40;
  
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0x20 < (ulong)((long)pbVar1 - (long)__rhs)) {
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,
               "given an invalid number of arguments. The command takes at most 1 argument.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    return false;
  }
  if (__rhs == pbVar1) {
    iVar3 = 0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)__rhs);
    bVar7 = true;
    if (iVar3 == 0) {
      iVar3 = 1;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar3 == 0) {
        iVar3 = 2;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                       ,"given an invalid scope: ",__rhs);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        iVar3 = 0;
        bVar7 = false;
      }
    }
    if (!bVar7) {
      return false;
    }
  }
  pcVar2 = status->Makefile;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CMAKE_CURRENT_LIST_FILE","");
  psVar4 = (string *)cmMakefile::GetDefinition(pcVar2,&local_60);
  cmCryptoHash::cmCryptoHash(&local_40,AlgoMD5);
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  input._M_str = (psVar4->_M_dataplus)._M_p;
  input._M_len = psVar4->_M_string_length;
  cmCryptoHash::HashString_abi_cxx11_(&local_a8,&local_40,input);
  local_f0._0_8_ = (pointer)0xb;
  local_f0._8_8_ = "__INCGUARD_";
  local_f0._16_8_ = 0;
  local_f0._24_8_ = local_a8._M_string_length;
  local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a8._M_dataplus._M_p;
  local_c0 = 2;
  local_b8 = "__";
  local_b0 = 0;
  views._M_len = 3;
  views._M_array = (iterator)local_f0;
  local_c8 = &local_a8;
  cmCatViews(&local_80,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  cmCryptoHash::~cmCryptoHash(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = status->Makefile;
  if (iVar3 == 0) {
    bVar7 = cmMakefile::IsDefinitionSet(pcVar2,&local_80);
    if (bVar7) goto LAB_002f08ae;
    cmMakefile::AddDefinitionBool(pcVar2,&local_80,true);
  }
  else if (iVar3 == 1) {
    cVar5 = cmMakefile::GetProperty(pcVar2,&local_80);
    if (cVar5.Value == (string *)0x0) {
      cmMakefile::GetStateSnapshot(pcVar2);
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_a8,(cmStateSnapshot *)local_f0);
      pcVar6 = cmStateSnapshot::GetState((cmStateSnapshot *)&local_a8);
      bVar7 = pcVar6 != (cmState *)0x0;
      if (bVar7) {
        do {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_f0,(cmStateSnapshot *)&local_a8);
          cVar5 = cmStateDirectory::GetProperty((cmStateDirectory *)local_f0,&local_80);
          if (cVar5.Value != (string *)0x0) break;
          cmStateSnapshot::GetBuildsystemDirectoryParent
                    ((cmStateSnapshot *)&local_60,(cmStateSnapshot *)&local_a8);
          local_a8.field_2._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
          local_a8._M_dataplus._M_p = local_60._M_dataplus._M_p;
          local_a8._M_string_length = local_60._M_string_length;
          pcVar6 = cmStateSnapshot::GetState((cmStateSnapshot *)&local_a8);
          bVar7 = pcVar6 != (cmState *)0x0;
        } while (bVar7);
      }
      if (!bVar7) {
        local_f0._0_8_ = local_f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"TRUE","");
        cmMakefile::SetProperty(pcVar2,&local_80,(string *)local_f0);
        if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        goto LAB_002f095f;
      }
    }
LAB_002f08ae:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&status->Variables,
                      (status->Variables).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    status->ReturnInvoked = true;
  }
  else {
    this = cmMakefile::GetCMakeInstance(pcVar2);
    cVar5 = cmake::GetProperty(this,&local_80);
    bVar7 = cVar5.Value != (string *)0x0;
    if (cVar5.Value == (string *)0x0) {
      local_f0._0_8_ = local_f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"TRUE","");
      cmake::SetProperty(this,&local_80,(string *)local_f0);
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&status->Variables,
                        (status->Variables).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      status->ReturnInvoked = true;
    }
    if (cVar5.Value != (string *)0x0) goto LAB_002f0962;
  }
LAB_002f095f:
  bVar7 = true;
LAB_002f0962:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool cmIncludeGuardCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() > 1) {
    status.SetError(
      "given an invalid number of arguments. The command takes at "
      "most 1 argument.");
    return false;
  }

  IncludeGuardScope scope = VARIABLE;

  if (!args.empty()) {
    std::string const& arg = args[0];
    if (arg == "DIRECTORY") {
      scope = DIRECTORY;
    } else if (arg == "GLOBAL") {
      scope = GLOBAL;
    } else {
      status.SetError("given an invalid scope: " + arg);
      return false;
    }
  }

  std::string includeGuardVar = GetIncludeGuardVariableName(
    *status.GetMakefile().GetDefinition("CMAKE_CURRENT_LIST_FILE"));

  cmMakefile* const mf = &status.GetMakefile();

  switch (scope) {
    case VARIABLE:
      if (mf->IsDefinitionSet(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->AddDefinitionBool(includeGuardVar, true);
      break;
    case DIRECTORY:
      if (CheckIncludeGuardIsSet(mf, includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      mf->SetProperty(includeGuardVar, "TRUE");
      break;
    case GLOBAL:
      cmake* const cm = mf->GetCMakeInstance();
      if (cm->GetProperty(includeGuardVar)) {
        status.SetReturnInvoked();
        return true;
      }
      cm->SetProperty(includeGuardVar, "TRUE");
      break;
  }

  return true;
}